

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O3

HRESULT __thiscall ConfigParser::SetOutputFile(ConfigParser *this,WCHAR *outputFile,WCHAR *openMode)

{
  WCHAR WVar1;
  short sVar2;
  char16 cVar3;
  char16_t cVar4;
  code *pcVar5;
  bool bVar6;
  DWORD DVar7;
  int iVar8;
  HRESULT HVar9;
  char16_t *pcVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  ulong uVar16;
  PAL_FILE *file;
  undefined4 *puVar17;
  long lVar18;
  char16 *pcVar19;
  char16 *pcVar20;
  size_t sVar21;
  char16 *pcVar22;
  long lVar23;
  char16_t *pcVar24;
  long lVar25;
  long lVar26;
  char16 *path;
  char16 local_678 [2];
  short local_674;
  short local_672;
  char16 moduleName [260];
  char16_t local_468;
  char16_t local_466 [3];
  WCHAR buffer [260];
  WCHAR local_258 [4];
  char16 fileName [260];
  
  pcVar10 = PAL_wcsstr(outputFile,L"{PID}");
  if (pcVar10 != (char16_t *)0x0) {
    lVar23 = (long)pcVar10 - (long)outputFile >> 1;
    lVar26 = (long)pcVar10 - (long)outputFile;
    if (lVar26 == 0) {
      pcVar24 = local_466;
      local_468 = L'\0';
      sVar21 = 0x206;
LAB_00361229:
      memset(pcVar24,0xfd,sVar21);
    }
    else if (outputFile == (WCHAR *)0x0) {
LAB_00361249:
      local_468 = L'\0';
      memset(local_466,0xfd,0x206);
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    }
    else if (lVar26 == -2) {
      lVar25 = -0x104;
      do {
        WVar1 = outputFile[lVar25 + 0x104];
        buffer[lVar25 + 0x100] = WVar1;
        if (WVar1 == L'\0') {
          lVar25 = -lVar25;
          goto LAB_00361205;
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 != 0);
LAB_0036123e:
      buffer[0xff] = L'\0';
    }
    else {
      lVar25 = 0x104 - lVar23;
      lVar18 = -0x104;
      do {
        lVar13 = lVar18;
        WVar1 = outputFile[lVar13 + 0x104];
        buffer[lVar13 + 0x100] = WVar1;
        if (WVar1 == L'\0') {
          lVar25 = -lVar13;
          goto LAB_00361205;
        }
        if (lVar13 == -1) {
          if (lVar26 != 0x204) goto LAB_00361249;
          goto LAB_0036123e;
        }
        lVar18 = lVar13 + 1;
      } while (lVar13 - lVar23 != -0x105);
      buffer[lVar13 + 0x101] = L'\0';
LAB_00361205:
      if (-lVar25 + 0x105U < 0x104) {
        pcVar24 = local_466 + -lVar25 + 0x104;
        sVar21 = lVar25 * 2 - 2;
        goto LAB_00361229;
      }
    }
    DVar7 = GetCurrentProcessId();
    pcVar24 = (char16_t *)((long)local_466 + lVar26 + -2);
    if (lVar26 == 0x208 || pcVar24 == (char16_t *)0x0) {
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    }
    else {
      _itow(DVar7,pcVar24,10);
    }
    sVar11 = PAL_wcslen(pcVar24);
    pcVar24 = pcVar24 + sVar11;
    sVar12 = PAL_wcslen(pcVar24);
    lVar23 = sVar12 + lVar23;
    lVar18 = lVar23 + -0x104;
    if (pcVar24 == (char16_t *)0x0 || lVar18 == 0) {
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    }
    else {
      uVar16 = -lVar18;
      lVar26 = (long)outputFile + lVar26 + 10;
      if (lVar26 != 0) {
        lVar25 = sVar11 * 2 - (long)outputFile;
        outputFile = &local_468;
        sVar21 = lVar23 * -2 + 0x206;
        lVar13 = 0;
        do {
          sVar2 = *(short *)(lVar26 + lVar13 * 2);
          *(short *)((long)outputFile + (long)pcVar10 + lVar13 * 2 + lVar25) = sVar2;
          if (sVar2 == 0) {
            if (lVar13 + 1U < uVar16) {
              outputFile = &local_468;
              memset((void *)((long)outputFile + (long)pcVar10 + lVar13 * 2 + lVar25 + 2),0xfd,
                     sVar21);
            }
            goto LAB_003613e1;
          }
          lVar13 = lVar13 + 1;
          sVar21 = sVar21 - 2;
        } while (0x104 - lVar23 != lVar13);
        *pcVar24 = L'\0';
        if (1 < uVar16) {
          memset(pcVar24 + 1,0xfd,lVar18 * -2 - 2);
        }
        RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
        goto LAB_003613e1;
      }
      *pcVar24 = L'\0';
      if (1 < uVar16) {
        memset(pcVar24 + 1,0xfd,lVar18 * -2 - 2);
      }
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    }
    outputFile = &local_468;
  }
LAB_003613e1:
  path = local_678;
  PlatformAgnostic::SystemInfo::GetBinaryLocation(path,0x104);
  if (local_678[0] == L'\\') {
    if ((local_678[1] == L'\\') && (local_674 == 0x3f)) {
      path = local_678 + (ulong)(local_672 == 0x5c) * 4;
      local_678[0] = *path;
      goto LAB_00361430;
    }
  }
  else {
LAB_00361430:
    if (local_678[0] == L'\0') goto LAB_00361447;
    local_678[1] = path[1];
  }
  path = path + (ulong)(local_678[1] == L':') * 2;
LAB_00361447:
  pcVar20 = (char16 *)0x0;
  pcVar14 = (char16 *)0x0;
  pcVar19 = path;
  pcVar22 = path;
  do {
    cVar3 = *pcVar22;
    pcVar15 = pcVar14;
    if ((ushort)cVar3 < 0x2f) {
      pcVar15 = pcVar22;
      if ((cVar3 != L'.') && (pcVar15 = pcVar14, cVar3 == L'\0')) break;
    }
    else if ((cVar3 == L'\\') || (cVar3 == L'/')) {
      pcVar20 = pcVar22 + 1;
    }
    pcVar22 = pcVar22 + 1;
    pcVar19 = pcVar19 + 1;
    pcVar14 = pcVar15;
  } while( true );
  if (pcVar20 != (char16 *)0x0) {
    path = pcVar20;
  }
  if ((pcVar14 == (char16 *)0x0) || (pcVar14 < path)) {
    uVar16 = (long)pcVar19 - (long)path >> 1;
    if (uVar16 < 0x104) goto LAB_003614cc;
LAB_003614d3:
    local_258[0] = L'\0';
    memset(local_258 + 1,0xfd,0x206);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else {
    uVar16 = (long)pcVar14 - (long)path >> 1;
    if (0x103 < uVar16) goto LAB_003614d3;
LAB_003614cc:
    wcsncpy_s(local_258,0x104,path,uVar16);
  }
  iVar8 = _wcsicmp(local_258,L"WWAHost");
  if ((((iVar8 == 0) || (iVar8 = _wcsicmp(local_258,L"ByteCodeGenerator"), iVar8 == 0)) ||
      (iVar8 = _wcsicmp(local_258,L"spartan"), iVar8 == 0)) ||
     (iVar8 = _wcsicmp(local_258,L"spartan_edge"), iVar8 == 0)) {
LAB_0036158e:
    DVar7 = GetEnvironmentVariableW(L"temp",local_258,0x104);
    if (DVar7 != 0) {
      uVar16 = 2;
      sVar21 = 0x204;
      do {
        if (buffer[uVar16 + 0x102] == L'\0') {
          buffer[uVar16 + 0x102] = L'\\';
          if (sVar21 != 0xfffffffffffffffe) {
            buffer[uVar16 + 0x103] = L'\0';
            if (uVar16 < 0x104) {
              memset(local_258 + uVar16,0xfd,sVar21);
            }
            goto LAB_0036166a;
          }
          break;
        }
        uVar16 = uVar16 + 1;
        sVar21 = sVar21 - 2;
      } while (sVar21 != 0xfffffffffffffffc);
      local_258[0] = L'\0';
      memset(local_258 + 1,0xfd,0x206);
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_0036166a:
      pcVar10 = PAL_wcsrchr(outputFile,L'\\');
      if (pcVar10 == (char16_t *)0x0) {
        pcVar10 = outputFile;
      }
      if (pcVar10 != (char16_t *)0x0) {
        uVar16 = 1;
        sVar21 = 0x206;
        do {
          if (buffer[uVar16 + 0x103] == L'\0') goto LAB_00361706;
          uVar16 = uVar16 + 1;
          sVar21 = sVar21 - 2;
        } while (sVar21 != 0xfffffffffffffffe);
      }
      goto LAB_003616a5;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                       ,700,"(0)","Get temp environment failed");
    if (!bVar6) goto LAB_003617fb;
    *puVar17 = 0;
    outputFile = local_258;
  }
  else {
    sVar11 = PAL_wcslen(L"MicrosoftEdge");
    iVar8 = _wcsnicmp(local_258,L"MicrosoftEdge",sVar11);
    if (iVar8 == 0) goto LAB_0036158e;
  }
  goto LAB_003616d1;
  while( true ) {
    pcVar10 = pcVar10 + 1;
    uVar16 = uVar16 + 1;
    sVar21 = sVar21 - 2;
    if (sVar21 == 0xfffffffffffffffe) break;
LAB_00361706:
    cVar4 = *pcVar10;
    buffer[uVar16 + 0x103] = cVar4;
    if (cVar4 == L'\0') {
      outputFile = local_258;
      if (uVar16 < 0x104) {
        memset(local_258 + uVar16,0xfd,sVar21);
      }
      goto LAB_003616d1;
    }
  }
LAB_003616a5:
  local_258[0] = L'\0';
  memset(local_258 + 1,0xfd,0x206);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  outputFile = local_258;
LAB_003616d1:
  file = _wfsopen(outputFile,openMode,0x20);
  if (file == (PAL_FILE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar17 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigParser.cpp"
                       ,0x2c8,"(false)","Could not open file for logging output.");
    if (!bVar6) {
LAB_003617fb:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar17 = 0;
    HVar9 = -0x7fffbffb;
  }
  else {
    Output::SetOutputFile(file);
    HVar9 = 0;
  }
  return HVar9;
}

Assistant:

HRESULT ConfigParser::SetOutputFile(const WCHAR* outputFile, const WCHAR* openMode)
{
    // If present, replace the {PID} token with the process ID
    const WCHAR* pidStr = nullptr;
    WCHAR buffer[_MAX_PATH];
    if ((pidStr = wcsstr(outputFile, _u("{PID}"))) != nullptr)
    {
        size_t pidStartPosition = pidStr - outputFile;

        WCHAR* pDest = buffer;
        size_t bufferLen = _MAX_PATH;

        // Copy the filename before the {PID} token
        wcsncpy_s(pDest, bufferLen, outputFile, pidStartPosition);
        pDest += pidStartPosition;
        bufferLen = bufferLen - pidStartPosition;

        // Copy the PID
        _itow_s(GetCurrentProcessId(), pDest, /*bufferSize=*/_MAX_PATH - pidStartPosition, /*radix=*/10);
#pragma prefast(suppress: 26014, "ultow string length is smaller than 256")
        pDest += wcslen(pDest);
        bufferLen = bufferLen - wcslen(pDest);

        // Copy the rest of the string.
#pragma prefast(suppress: 26014, "Overwriting pDset's null terminator is intentional since the string being copied is null terminated")
        wcscpy_s(pDest, bufferLen, outputFile + pidStartPosition + /*length of {PID}*/ 5);

        outputFile = buffer;
    }

    char16 fileName[_MAX_PATH];
    char16 moduleName[_MAX_PATH];
    PlatformAgnostic::SystemInfo::GetBinaryLocation(moduleName, _MAX_PATH);
    _wsplitpath_s(moduleName, nullptr, 0, nullptr, 0, fileName, _MAX_PATH, nullptr, 0);
    if (_wcsicmp(fileName, _u("WWAHost")) == 0 ||
        _wcsicmp(fileName, _u("ByteCodeGenerator")) == 0 ||
        _wcsicmp(fileName, _u("spartan")) == 0 ||
        _wcsicmp(fileName, _u("spartan_edge")) == 0 ||
        _wcsnicmp(fileName, _u("MicrosoftEdge"), wcslen(_u("MicrosoftEdge"))) == 0)
    {

        // we need to output to %temp% directory in wwa. we don't have permission otherwise.
        if (GetEnvironmentVariable(_u("temp"), fileName, _MAX_PATH) != 0)
        {
            wcscat_s(fileName, _MAX_PATH, _u("\\"));
            const char16 * fileNameOnly = wcsrchr(outputFile, _u('\\'));
            // if outputFile is full path we just need filename, discard the path
            wcscat_s(fileName, _MAX_PATH, fileNameOnly == nullptr ? outputFile : fileNameOnly);
        }
        else
        {
            AssertMsg(FALSE, "Get temp environment failed");
        }
        outputFile = fileName;
    }

    FILE *fp;
    if ((fp = _wfsopen(outputFile, openMode, _SH_DENYWR)) != nullptr)
    {
        Output::SetOutputFile(fp);
        return S_OK;
    }

    AssertMsg(false, "Could not open file for logging output.");
    return E_FAIL;
}